

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O1

void BinarySink_put_padding(BinarySink *bs,size_t len,uchar padbyte)

{
  undefined1 uVar1;
  undefined7 in_register_00000011;
  size_t sVar2;
  undefined1 uVar4;
  undefined1 auVar3 [16];
  char buf [16];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  uVar1 = (undefined1)((uint7)in_register_00000011 >> 8);
  uVar4 = (undefined1)((uint7)in_register_00000011 >> 0x10);
  auVar3[7] = uVar4;
  auVar3[6] = uVar4;
  auVar3[5] = uVar1;
  auVar3[4] = uVar1;
  auVar3[3] = (char)in_register_00000011;
  auVar3[2] = (char)in_register_00000011;
  auVar3[1] = padbyte;
  auVar3[0] = padbyte;
  auVar3._8_8_ = 0;
  auVar3 = pshuflw(auVar3,auVar3,0);
  local_38 = auVar3._0_4_;
  uStack_34 = local_38;
  uStack_30 = local_38;
  uStack_2c = local_38;
  if (len != 0) {
    do {
      sVar2 = 0x10;
      if (len < 0x10) {
        sVar2 = len;
      }
      (*bs->write)(bs,&local_38,sVar2);
      len = len - sVar2;
    } while (len != 0);
  }
  return;
}

Assistant:

void BinarySink_put_padding(BinarySink *bs, size_t len, unsigned char padbyte)
{
    char buf[16];
    memset(buf, padbyte, sizeof(buf));
    while (len > 0) {
        size_t thislen = len < sizeof(buf) ? len : sizeof(buf);
        bs->write(bs, buf, thislen);
        len -= thislen;
    }
}